

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O3

void file_set_attr(filetype_t type,int tmp)

{
  long lVar1;
  long lVar2;
  file_entry_t *pfVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  
  pfVar3 = cur;
  pcVar5 = (cur->file).name;
  lVar7 = -1;
  do {
    lVar1 = lVar7 + 1;
    lVar7 = lVar7 + 1;
  } while (pcVar5[lVar1] != '\0');
  do {
    if (lVar7 == 0) goto LAB_001077ae;
    lVar1 = lVar7 + -1;
    lVar2 = lVar7 + -1;
    lVar7 = lVar1;
  } while (pcVar5[lVar2] != '.');
  pcVar5[lVar1] = '\0';
  pcVar5 = (pfVar3->file).name;
LAB_001077ae:
  sVar4 = strlen(pcVar5);
  pcVar5 = (char *)mrealloc(pcVar5,sVar4 + 3);
  pfVar3 = cur;
  (cur->file).name = pcVar5;
  do {
    pcVar6 = pcVar5;
    pcVar5 = pcVar6 + 1;
  } while (*pcVar6 != '\0');
  *pcVar6 = '.';
  pcVar6[1] = "ciso"[type];
  pcVar6[2] = '\0';
  (pfVar3->file).type = type;
  (pfVar3->file).tmp = tmp;
  return;
}

Assistant:

void file_set_attr(filetype_t type, int tmp)
{
    char* p = cur->file.name;
    while (*p)
        ++p;
    while (*p != '.' && p != cur->file.name)
        --p;

    if (*p == '.')
        *p = 0;

    cur->file.name = (char*)mrealloc(cur->file.name,
                                     strlen(cur->file.name) + 3);

    p = cur->file.name;
    while (*p != 0)
        ++p;

    *p++ = '.';
    *p++ = "ciso"[type];
    *p = 0;

    cur->file.type = type;
    cur->file.tmp = tmp;
}